

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::PopAndCheck3Types
          (TypeChecker *this,Type expected1,Type expected2,Type expected3,char *desc)

{
  Result RVar1;
  char *desc_local;
  Type expected3_local;
  Type expected2_local;
  Type expected1_local;
  TypeChecker *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  RVar1 = PeekAndCheckType(this,0,expected3);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = PeekAndCheckType(this,1,expected2);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = PeekAndCheckType(this,2,expected1);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
            (this,this_local._4_4_,desc,expected1,expected2,expected3);
  RVar1 = DropTypes(this,3);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::PopAndCheck3Types(Type expected1,
                                      Type expected2,
                                      Type expected3,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected3);
  result |= PeekAndCheckType(1, expected2);
  result |= PeekAndCheckType(2, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2, expected3);
  result |= DropTypes(3);
  return result;
}